

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
          (DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *this,Formula **key)

{
  Entry *pEVar1;
  uint uVar2;
  uint uVar3;
  Entry *pEVar4;
  uint uVar5;
  int iVar6;
  size_t i;
  long lVar7;
  ulong uVar8;
  Entry *pEVar9;
  Formula *local_10;
  
  uVar2 = this->_capacity;
  if (uVar2 == 0) {
    pEVar9 = (Entry *)0x0;
  }
  else {
    local_10 = *key;
    uVar5 = 0x811c9dc5;
    lVar7 = 0;
    do {
      uVar5 = (*(byte *)((long)&local_10 + lVar7) ^ uVar5) * 0x1000193;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    uVar8 = (ulong)uVar5 % (ulong)uVar2;
    pEVar4 = this->_entries;
    uVar5 = pEVar4[uVar8].field_0._infoData;
    uVar3 = this->_timestamp;
    pEVar9 = (Entry *)0x0;
    if (uVar5 >> 2 == uVar3) {
      if (pEVar4[uVar8]._key == local_10) {
        pEVar9 = (Entry *)0x0;
        if ((uVar5 & 1) == 0) {
          pEVar9 = pEVar4 + uVar8;
        }
      }
      else if ((uVar5 & 2) == 0) {
        pEVar9 = (Entry *)0x0;
      }
      else {
        iVar6 = (int)(((ulong)local_10 & 0xffffffff) % (ulong)uVar2);
        do {
          uVar8 = (ulong)((int)uVar8 + iVar6 + (uint)(iVar6 == 0)) % (ulong)uVar2;
          pEVar1 = pEVar4 + uVar8;
          uVar5 = (uint)(pEVar1->field_0)._infoData >> 2;
          if (uVar5 != uVar3) break;
        } while (pEVar1->_key != local_10);
        pEVar9 = (Entry *)0x0;
        if (((pEVar1->field_0)._infoData & 1U) == 0 && uVar5 == uVar3) {
          pEVar9 = pEVar1;
        }
      }
    }
  }
  return pEVar9;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }